

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceObjectArchive::DeviceObjectArchive(DeviceObjectArchive *this,CreateInfo *CI)

{
  bool bVar1;
  CreateInfo *CI_local;
  DeviceObjectArchive *this_local;
  
  std::
  unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
  ::unordered_map(&this->m_NamedResources);
  std::array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
  ::array(&this->m_DeviceShaders);
  RefCntAutoPtr<Diligent::IDataBlob>::RefCntAutoPtr(&this->m_pArchiveData);
  this->m_ContentVersion = 0;
  bVar1 = Deserialize(this,CI);
  if (!bVar1) {
    LogError<true,char[44]>
              (false,"DeviceObjectArchive",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
               ,0x15b,(char (*) [44])"Failed to deserialize device object archive");
  }
  return;
}

Assistant:

DeviceObjectArchive::DeviceObjectArchive(const CreateInfo& CI) noexcept(false)
{
    if (!Deserialize(CI))
    {
        LOG_ERROR_AND_THROW("Failed to deserialize device object archive");
    }
}